

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayGenerateMipMapNonFilterable::initTest
          (TextureCubeMapArrayGenerateMipMapNonFilterable *this)

{
  vector<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_> *this_00;
  pointer *ppSVar1;
  iterator iVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  char *msg;
  GLuint *pGVar6;
  pointer pSVar7;
  StorageConfig storage_config4;
  StorageConfig storage_config3;
  StorageConfig storage_config2;
  StorageConfig storage_config1;
  long lVar5;
  
  iVar3 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  pSVar7 = (this->m_non_filterable_texture_configs).
           super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_non_filterable_texture_configs).
      super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
      super__Vector_impl_data._M_finish != pSVar7) {
    (this->m_non_filterable_texture_configs).
    super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar7;
  }
  this_00 = &this->m_non_filterable_texture_configs;
  (**(code **)(lVar5 + 0xff0))(0xd05,1);
  (**(code **)(lVar5 + 0xff0))(0xcf5,1);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glPixelStorei() call(s) failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                  ,0x226);
  storage_config1.m_width = 0x40;
  storage_config1.m_depth = 0x12;
  storage_config1.m_height = 0x40;
  storage_config1.m_levels = 7;
  storage_config1.m_to_id = 0;
  storage_config2.m_width = 0x75;
  storage_config2.m_depth = 6;
  storage_config2.m_height = 0x75;
  storage_config2.m_levels = 7;
  storage_config2.m_to_id = 0;
  storage_config3.m_width = 0x100;
  storage_config3.m_depth = 6;
  storage_config3.m_height = 0x100;
  storage_config3.m_levels = 9;
  storage_config3.m_to_id = 0;
  storage_config4.m_width = 0xad;
  storage_config4.m_depth = 0xc;
  storage_config4.m_height = 0xad;
  storage_config4.m_levels = 8;
  storage_config4.m_to_id = 0;
  iVar2._M_current =
       (this->m_non_filterable_texture_configs).
       super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_non_filterable_texture_configs).
      super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glcts::StorageConfig,std::allocator<glcts::StorageConfig>>::
    _M_realloc_insert<glcts::StorageConfig_const&>
              ((vector<glcts::StorageConfig,std::allocator<glcts::StorageConfig>> *)this_00,iVar2,
               &storage_config1);
  }
  else {
    (iVar2._M_current)->m_width = 0x40;
    (iVar2._M_current)->m_depth = 0x12;
    (iVar2._M_current)->m_height = 0x40;
    (iVar2._M_current)->m_levels = 7;
    (iVar2._M_current)->m_to_id = 0;
    ppSVar1 = &(this->m_non_filterable_texture_configs).
               super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  iVar2._M_current =
       (this->m_non_filterable_texture_configs).
       super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_non_filterable_texture_configs).
      super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glcts::StorageConfig,std::allocator<glcts::StorageConfig>>::
    _M_realloc_insert<glcts::StorageConfig_const&>
              ((vector<glcts::StorageConfig,std::allocator<glcts::StorageConfig>> *)this_00,iVar2,
               &storage_config2);
  }
  else {
    (iVar2._M_current)->m_width = storage_config2.m_width;
    (iVar2._M_current)->m_depth = storage_config2.m_depth;
    (iVar2._M_current)->m_height = storage_config2.m_height;
    (iVar2._M_current)->m_levels = storage_config2.m_levels;
    (iVar2._M_current)->m_to_id = storage_config2.m_to_id;
    ppSVar1 = &(this->m_non_filterable_texture_configs).
               super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  iVar2._M_current =
       (this->m_non_filterable_texture_configs).
       super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_non_filterable_texture_configs).
      super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glcts::StorageConfig,std::allocator<glcts::StorageConfig>>::
    _M_realloc_insert<glcts::StorageConfig_const&>
              ((vector<glcts::StorageConfig,std::allocator<glcts::StorageConfig>> *)this_00,iVar2,
               &storage_config3);
  }
  else {
    (iVar2._M_current)->m_width = storage_config3.m_width;
    (iVar2._M_current)->m_depth = storage_config3.m_depth;
    (iVar2._M_current)->m_height = storage_config3.m_height;
    (iVar2._M_current)->m_levels = storage_config3.m_levels;
    (iVar2._M_current)->m_to_id = storage_config3.m_to_id;
    ppSVar1 = &(this->m_non_filterable_texture_configs).
               super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  iVar2._M_current =
       (this->m_non_filterable_texture_configs).
       super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_non_filterable_texture_configs).
      super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<glcts::StorageConfig,std::allocator<glcts::StorageConfig>>::
    _M_realloc_insert<glcts::StorageConfig_const&>
              ((vector<glcts::StorageConfig,std::allocator<glcts::StorageConfig>> *)this_00,iVar2,
               &storage_config4);
  }
  else {
    (iVar2._M_current)->m_width = storage_config4.m_width;
    (iVar2._M_current)->m_depth = storage_config4.m_depth;
    (iVar2._M_current)->m_height = storage_config4.m_height;
    (iVar2._M_current)->m_levels = storage_config4.m_levels;
    (iVar2._M_current)->m_to_id = storage_config4.m_to_id;
    ppSVar1 = &(this->m_non_filterable_texture_configs).
               super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  pSVar7 = (this->m_non_filterable_texture_configs).
           super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pSVar7 != (this->m_non_filterable_texture_configs).
                super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    pGVar6 = &pSVar7->m_to_id;
    do {
      (**(code **)(lVar5 + 0x6f8))(1,pGVar6);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glGenTextures() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                      ,0x262);
      (**(code **)(lVar5 + 0xb8))(0x9009,*pGVar6);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glBindTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                      ,0x265);
      (**(code **)(lVar5 + 0x1360))(0x9009,0x2800,0x2601);
      (**(code **)(lVar5 + 0x1360))(0x9009,0x2801,0x2601);
      dVar4 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar4,"glTexParameteri() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                      ,0x269);
      if (this->m_storage_type == ST_MUTABLE) {
        (**(code **)(lVar5 + 0x1320))
                  (0x9009,0,0x8d82,pGVar6[1],pGVar6[-2],((StorageConfig *)(pGVar6 + -3))->m_depth,0,
                   0x8d99,0x1404,0);
        dVar4 = (**(code **)(lVar5 + 0x800))();
        msg = "glTexImage3D() call failed.";
        iVar3 = 0x272;
      }
      else {
        (**(code **)(lVar5 + 0x1398))
                  (0x9009,pGVar6[-1],0x8d82,pGVar6[1],pGVar6[-2],
                   ((StorageConfig *)(pGVar6 + -3))->m_depth);
        dVar4 = (**(code **)(lVar5 + 0x800))();
        msg = "glTexStorage3D() call failed.";
        iVar3 = 0x279;
      }
      glu::checkError(dVar4,msg,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGenerateMipMap.cpp"
                      ,iVar3);
      pSVar7 = (pointer)(pGVar6 + 2);
      pGVar6 = pGVar6 + 5;
    } while (pSVar7 != (this->m_non_filterable_texture_configs).
                       super__Vector_base<glcts::StorageConfig,_std::allocator<glcts::StorageConfig>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void TextureCubeMapArrayGenerateMipMapNonFilterable::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Make sure no configs are already in place */
	m_non_filterable_texture_configs.clear();

	/* Update pixel pack/unpack settings */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei() call(s) failed");

	/* Define a number of storage configurations, all using GL_RGBA32I
	 * internalformat:
	 *
	 *    [width x height x depth]
	 * 1)   64   x   64   x  18;
	 * 2)  117   x  117   x   6;
	 * 3)  256   x  256   x   6;
	 * 4)  173   x  173   x  12;
	 */

	/* Size 64 x 64 x 18 */
	StorageConfig storage_config1;

	storage_config1.m_width  = 64;
	storage_config1.m_height = 64;
	storage_config1.m_depth  = 18;
	storage_config1.m_to_id  = 0;
	storage_config1.m_levels = getAmountOfLevelsForTexture(storage_config1.m_width, storage_config1.m_height);

	/* Size 117 x 117 x 6 */
	StorageConfig storage_config2;

	storage_config2.m_width  = 117;
	storage_config2.m_height = 117;
	storage_config2.m_depth  = 6;
	storage_config2.m_to_id  = 0;
	storage_config2.m_levels = getAmountOfLevelsForTexture(storage_config2.m_width, storage_config2.m_height);

	/* Size 256 x 256 x 6 */
	StorageConfig storage_config3;

	storage_config3.m_width  = 256;
	storage_config3.m_height = 256;
	storage_config3.m_depth  = 6;
	storage_config3.m_to_id  = 0;
	storage_config3.m_levels = getAmountOfLevelsForTexture(storage_config3.m_width, storage_config3.m_height);

	/* Size 173 x 173 x 12 */
	StorageConfig storage_config4;

	storage_config4.m_width  = 173;
	storage_config4.m_height = 173;
	storage_config4.m_depth  = 12;
	storage_config4.m_to_id  = 0;
	storage_config4.m_levels = getAmountOfLevelsForTexture(storage_config4.m_width, storage_config4.m_height);

	m_non_filterable_texture_configs.push_back(storage_config1);
	m_non_filterable_texture_configs.push_back(storage_config2);
	m_non_filterable_texture_configs.push_back(storage_config3);
	m_non_filterable_texture_configs.push_back(storage_config4);

	/* Generate and configure a texture object for each storage config. */
	for (std::vector<StorageConfig>::iterator storage_config_iterator = m_non_filterable_texture_configs.begin();
		 storage_config_iterator != m_non_filterable_texture_configs.end(); storage_config_iterator++)
	{
		StorageConfig& storage_config = *storage_config_iterator;

		gl.genTextures(1, &storage_config.m_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

		gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, storage_config.m_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		gl.texParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri() call(s) failed.");

		/* Initialize texture storage. */
		if (m_storage_type == ST_MUTABLE)
		{
			gl.texImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, /* level */
						  GL_RGBA32I, storage_config.m_width, storage_config.m_height, storage_config.m_depth, 0,
						  GL_RGBA_INTEGER, GL_INT, 0); /* data */

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexImage3D() call failed.");
		}
		else
		{
			gl.texStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, storage_config.m_levels, GL_RGBA32I, storage_config.m_width,
							storage_config.m_height, storage_config.m_depth);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage3D() call failed.");
		}
	} /* for (all storage configs) */
}